

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lemon.c
# Opt level: O3

void buildshifts(lemon *lemp,state *stp)

{
  config **ppcVar1;
  int iVar2;
  symbol *b;
  rule *rp;
  int iVar3;
  config *pcVar4;
  config *pcVar5;
  plink *ppVar6;
  state *arg;
  long lVar7;
  config *pcVar8;
  
  pcVar8 = stp->cfp;
  pcVar4 = pcVar8;
  if (pcVar8 != (config *)0x0) {
    do {
      pcVar4->status = INCOMPLETE;
      ppcVar1 = &pcVar4->next;
      pcVar4 = *ppcVar1;
    } while (*ppcVar1 != (config *)0x0);
    if (pcVar8 != (config *)0x0) {
      do {
        if ((pcVar8->status != COMPLETE) && (pcVar8->dot < pcVar8->rp->nrhs)) {
          Configlist_reset();
          b = pcVar8->rp->rhs[pcVar8->dot];
          pcVar4 = pcVar8;
          do {
            if (pcVar4->status != COMPLETE) {
              iVar2 = pcVar4->dot;
              rp = pcVar4->rp;
              if ((iVar2 < rp->nrhs) && (iVar3 = same_symbol(rp->rhs[iVar2],b), iVar3 != 0)) {
                pcVar4->status = COMPLETE;
                pcVar5 = Configlist_addbasis(rp,iVar2 + 1);
                ppVar6 = Plink_new();
                ppVar6->next = pcVar5->bplp;
                pcVar5->bplp = ppVar6;
                ppVar6->cfp = pcVar4;
              }
            }
            pcVar4 = pcVar4->next;
          } while (pcVar4 != (config *)0x0);
          arg = getstate(lemp);
          if (b->type == MULTITERMINAL) {
            if (0 < b->nsubsym) {
              lVar7 = 0;
              do {
                Action_add(&stp->ap,SHIFT,b->subsym[lVar7],(char *)arg);
                lVar7 = lVar7 + 1;
              } while (lVar7 < b->nsubsym);
            }
          }
          else {
            Action_add(&stp->ap,SHIFT,b,(char *)arg);
          }
        }
        pcVar8 = pcVar8->next;
      } while (pcVar8 != (config *)0x0);
    }
  }
  return;
}

Assistant:

PRIVATE void buildshifts(struct lemon *lemp, struct state *stp)
{
  struct config *cfp;  /* For looping thru the config closure of "stp" */
  struct config *bcfp; /* For the inner loop on config closure of "stp" */
  struct config *newcfg;  /* */
  struct symbol *sp;   /* Symbol following the dot in configuration "cfp" */
  struct symbol *bsp;  /* Symbol following the dot in configuration "bcfp" */
  struct state *newstp; /* A pointer to a successor state */

  /* Each configuration becomes complete after it contibutes to a successor
  ** state.  Initially, all configurations are incomplete */
  for(cfp=stp->cfp; cfp; cfp=cfp->next) cfp->status = INCOMPLETE;

  /* Loop through all configurations of the state "stp" */
  for(cfp=stp->cfp; cfp; cfp=cfp->next){
    if( cfp->status==COMPLETE ) continue;    /* Already used by inner loop */
    if( cfp->dot>=cfp->rp->nrhs ) continue;  /* Can't shift this config */
    Configlist_reset();                      /* Reset the new config set */
    sp = cfp->rp->rhs[cfp->dot];             /* Symbol after the dot */

    /* For every configuration in the state "stp" which has the symbol "sp"
    ** following its dot, add the same configuration to the basis set under
    ** construction but with the dot shifted one symbol to the right. */
    for(bcfp=cfp; bcfp; bcfp=bcfp->next){
      if( bcfp->status==COMPLETE ) continue;    /* Already used */
      if( bcfp->dot>=bcfp->rp->nrhs ) continue; /* Can't shift this one */
      bsp = bcfp->rp->rhs[bcfp->dot];           /* Get symbol after dot */
      if( !same_symbol(bsp,sp) ) continue;      /* Must be same as for "cfp" */
      bcfp->status = COMPLETE;                  /* Mark this config as used */
      newcfg = Configlist_addbasis(bcfp->rp,bcfp->dot+1);
      Plink_add(&newcfg->bplp,bcfp);
    }

    /* Get a pointer to the state described by the basis configuration set
    ** constructed in the preceding loop */
    newstp = getstate(lemp);

    /* The state "newstp" is reached from the state "stp" by a shift action
    ** on the symbol "sp" */
    if( sp->type==MULTITERMINAL ){
      int i;
      for(i=0; i<sp->nsubsym; i++){
        Action_add(&stp->ap,SHIFT,sp->subsym[i],(char*)newstp);
      }
    }else{
      Action_add(&stp->ap,SHIFT,sp,(char *)newstp);
    }
  }
}